

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-platform.c
# Opt level: O3

int yescrypt_init_shared
              (yescrypt_shared_t *shared,uint8_t *param,size_t paramlen,uint64_t N,uint32_t r,
              uint32_t p,yescrypt_init_shared_flags_t flags,uint8_t *buf,size_t buflen)

{
  int iVar1;
  ulong N_00;
  yescrypt_shared_t half2;
  yescrypt_shared_t half1;
  uint8_t salt [32];
  
  if ((flags >> 8 & 1) == 0) {
    shared->base_size = 0;
    shared->aligned_size = 0;
    shared->base = (void *)0x0;
    shared->aligned = (void *)0x0;
  }
  else {
    if (shared->aligned == (void *)0x0) {
      return -1;
    }
    if (shared->aligned_size == 0) {
      return -1;
    }
  }
  if ((buf == (uint8_t *)0x0 &&
      ((p == 0 && r == 0) && ((N == 0 && paramlen == 0) && param == (uint8_t *)0x0))) && buflen == 0
     ) {
    return 0;
  }
  iVar1 = yescrypt_kdf((yescrypt_shared_t *)0x0,shared,param,paramlen,(uint8_t *)0x0,0,N,r,p,0,0,
                       __YESCRYPT_INIT_SHARED_1|YESCRYPT_RW,salt,0x20);
  if (iVar1 == 0) {
    half2.base = shared->base;
    half2.base_size = shared->base_size;
    half1.base = shared->base;
    half1.aligned = shared->aligned;
    half1.base_size = shared->base_size;
    half2.aligned_size = shared->aligned_size >> 1;
    half2.aligned = (void *)((long)shared->aligned + half2.aligned_size);
    N_00 = N >> 1;
    half1.aligned_size = half2.aligned_size;
    if (((p < 2) ||
        (iVar1 = yescrypt_kdf(&half1,&half2,param,paramlen,salt,0x20,N_00,r,p,0,0,
                              __YESCRYPT_INIT_SHARED_2|YESCRYPT_RW,salt,0x20), iVar1 == 0)) &&
       (iVar1 = yescrypt_kdf(&half2,&half1,param,paramlen,salt,0x20,N_00,r,p,0,0,
                             __YESCRYPT_INIT_SHARED_1|YESCRYPT_RW,salt,0x20), iVar1 == 0)) {
      iVar1 = yescrypt_kdf(&half1,&half2,param,paramlen,salt,0x20,N_00,r,p,0,0,
                           __YESCRYPT_INIT_SHARED_1|YESCRYPT_RW,buf,buflen);
      if (iVar1 == 0 || (flags & YESCRYPT_SHARED_PREALLOCATED) != YESCRYPT_SHARED_DEFAULTS) {
        return -(uint)(iVar1 != 0);
      }
      goto LAB_00114dcb;
    }
  }
  if ((flags >> 8 & 1) != 0) {
    return -1;
  }
LAB_00114dcb:
  if ((shared->base != (void *)0x0) && (iVar1 = munmap(shared->base,shared->base_size), iVar1 != 0))
  {
    return -1;
  }
  shared->base_size = 0;
  shared->aligned_size = 0;
  shared->base = (void *)0x0;
  shared->aligned = (void *)0x0;
  return -1;
}

Assistant:

int
yescrypt_init_shared(yescrypt_shared_t * shared,
    const uint8_t * param, size_t paramlen,
    uint64_t N, uint32_t r, uint32_t p,
    yescrypt_init_shared_flags_t flags,
    uint8_t * buf, size_t buflen)
{
	yescrypt_shared_t half1, half2;
	uint8_t salt[32];

	if (flags & YESCRYPT_SHARED_PREALLOCATED) {
		if (!shared->aligned || !shared->aligned_size)
			return -1;
	} else {
		init_region(shared);
	}
	if (!param && !paramlen && !N && !r && !p && !buf && !buflen)
		return 0;

	if (yescrypt_kdf(NULL, shared,
	    param, paramlen, NULL, 0, N, r, p, 0, 0,
	    YESCRYPT_RW | __YESCRYPT_INIT_SHARED_1,
	    salt, sizeof(salt)))
		goto out;

	half1 = half2 = *shared;
	half1.aligned_size /= 2;
	half2.aligned += half1.aligned_size;
	half2.aligned_size = half1.aligned_size;
	N /= 2;

	if (p > 1 && yescrypt_kdf(&half1, &half2,
	    param, paramlen, salt, sizeof(salt), N, r, p, 0, 0,
	    YESCRYPT_RW | __YESCRYPT_INIT_SHARED_2,
	    salt, sizeof(salt)))
		goto out;

	if (yescrypt_kdf(&half2, &half1,
	    param, paramlen, salt, sizeof(salt), N, r, p, 0, 0,
	    YESCRYPT_RW | __YESCRYPT_INIT_SHARED_1,
	    salt, sizeof(salt)))
		goto out;

	if (yescrypt_kdf(&half1, &half2,
	    param, paramlen, salt, sizeof(salt), N, r, p, 0, 0,
	    YESCRYPT_RW | __YESCRYPT_INIT_SHARED_1,
	    buf, buflen))
		goto out;

	return 0;

out:
	if (!(flags & YESCRYPT_SHARED_PREALLOCATED))
		free_region(shared);
	return -1;
}